

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

unsigned_long __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STInteger<unsigned_long>,unsigned_long>
          (STObject *this,SField *field)

{
  int iVar1;
  STBase *pSVar2;
  long lVar3;
  unsigned_long uVar4;
  
  pSVar2 = peekAtPField(this,field);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])(pSVar2);
  if (iVar1 == 0) {
    uVar4 = 0;
  }
  else {
    lVar3 = __dynamic_cast(pSVar2,&STBase::typeinfo,&STInteger<unsigned_long>::typeinfo,0);
    if (lVar3 == 0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    uVar4 = *(unsigned_long *)(lVar3 + 0x10);
  }
  return uVar4;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }